

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

XMLCh * __thiscall PSVIWriterHandlers::getIdName(PSVIWriterHandlers *this,XSObject *obj)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar1;
  BaseRefVectorOf<char16_t> *this_00;
  XMLSize_t XVar2;
  bool bVar3;
  wchar16 *key1;
  ulong uVar4;
  XMLCh *valueToAdopt;
  wchar16 *pwVar5;
  wchar16 wVar6;
  RefHashTableBucketElem<char16_t> *pRVar7;
  
  key1 = (wchar16 *)operator_new__(0x12);
  xercesc_4_0::XMLString::sizeToText
            ((ulong)obj,key1,8,0x10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pRVar1 = this->fIdMap;
  uVar4 = (ulong)(ushort)*key1;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    wVar6 = key1[1];
    if (wVar6 != L'\0') {
      pwVar5 = key1 + 2;
      do {
        uVar4 = (ulong)(ushort)wVar6 + (uVar4 >> 0x18) + uVar4 * 0x26;
        wVar6 = *pwVar5;
        pwVar5 = pwVar5 + 1;
      } while (wVar6 != L'\0');
    }
    uVar4 = uVar4 % pRVar1->fHashModulus;
  }
  pRVar7 = pRVar1->fBucketList[uVar4];
  if (pRVar7 != (RefHashTableBucketElem<char16_t> *)0x0) {
    do {
      bVar3 = xercesc_4_0::StringHasher::equals
                        ((StringHasher *)&pRVar1->field_0x30,key1,pRVar7->fKey);
      if (bVar3) goto LAB_00113d1a;
      pRVar7 = pRVar7->fNext;
    } while (pRVar7 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  pRVar7 = (RefHashTableBucketElem<char16_t> *)0x0;
LAB_00113d1a:
  if (pRVar7 == (RefHashTableBucketElem<char16_t> *)0x0) {
    valueToAdopt = (XMLCh *)0x0;
  }
  else {
    valueToAdopt = pRVar7->fData;
  }
  if (valueToAdopt == (XMLCh *)0x0) {
    valueToAdopt = createID(this,obj);
    xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
              (this->fIdMap,key1,valueToAdopt);
    this_00 = &this->fObjectLocations->super_BaseRefVectorOf<char16_t>;
    xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_00,1);
    XVar2 = this_00->fCurCount;
    this_00->fElemList[XVar2] = key1;
    this_00->fCurCount = XVar2 + 1;
  }
  else {
    operator_delete__(key1);
  }
  return valueToAdopt;
}

Assistant:

const XMLCh* PSVIWriterHandlers::getIdName(XSObject* obj) {
	XMLCh* objLoc = new XMLCh[9];
	XMLString::sizeToText((XMLSize_t)obj, objLoc, 8, 16);
	XMLCh* idName = fIdMap->get(objLoc);
	if (!idName) {
		idName = createID(obj);
		fIdMap->put(objLoc, idName);
		fObjectLocations->addElement(objLoc);
	} else {
		delete[] objLoc;
	}
	return idName;
}